

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O1

ON_UUID __thiscall
ON_3dmRenderSettings::RenderEnvironmentId
          (ON_3dmRenderSettings *this,EnvironmentUsage usage,EnvironmentPurpose purpose)

{
  undefined4 uVar1;
  undefined2 uVar2;
  ON_EnvironmentsImpl *this_00;
  undefined2 uVar3;
  ON_UUID *pOVar4;
  bool bVar5;
  int iVar6;
  ON_Skylight *pOVar7;
  ON_UUID *pOVar8;
  ON_UUID OVar9;
  ON_UUID uuid_env;
  ON_UUID local_30;
  
  ON_3dmRenderSettingsPrivate::Get(this);
  ON_REMOVE_ASAP_AssertEx
            ((uint)(this->m_private->_environments != (ON_EnvironmentsImpl *)0x0),
             "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_settings.cpp"
             ,0x6fd,"","nullptr != m_private->_environments is false");
  this_00 = this->m_private->_environments;
  if (purpose == ForRendering) {
    if (usage != Reflection) {
      if (usage == Skylighting) {
        pOVar7 = Skylight(this);
        iVar6 = (*pOVar7->_vptr_ON_Skylight[5])(pOVar7);
        if ((char)iVar6 != '\0') {
          bVar5 = ON_EnvironmentsImpl::SkylightingRenderEnvironmentOverride(this_00);
          if (bVar5) goto LAB_0037757c;
          goto LAB_00377650;
        }
      }
      else if (this->m_background_style == 3) {
        local_30 = ON_EnvironmentsImpl::BackgroundRenderEnvironmentId(this_00);
        bVar5 = ON_UuidIsNotNil(&local_30);
        pOVar4 = &ON_UuidDefaultEnvironmentInstance;
        if (bVar5) {
          pOVar4 = &local_30;
        }
        pOVar8 = &ON_UuidDefaultEnvironmentInstance;
        if (bVar5) {
          pOVar8 = &local_30;
        }
        uVar1 = pOVar8->Data1;
        uVar2 = pOVar8->Data2;
        uVar3 = pOVar8->Data3;
        OVar9.Data3 = uVar3;
        OVar9.Data2 = uVar2;
        OVar9.Data1 = uVar1;
        OVar9.Data4 = *&pOVar4->Data4;
        return OVar9;
      }
      goto LAB_003775dc;
    }
    bVar5 = ON_EnvironmentsImpl::ReflectionRenderEnvironmentOverride(this_00);
    if (!bVar5) {
LAB_00377650:
      OVar9 = RenderEnvironmentId(this,Background,ForRendering);
      return OVar9;
    }
  }
  else {
    if (purpose != Standard) {
      ON_REMOVE_ASAP_AssertEx
                (0,
                 "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_settings.cpp"
                 ,0x72e,"","false is false");
LAB_003775dc:
      return (ON_UUID)ZEXT816((ulong)0);
    }
    if (usage != Reflection) {
      if (usage != Skylighting) {
        OVar9 = ON_EnvironmentsImpl::BackgroundRenderEnvironmentId(this_00);
        return OVar9;
      }
LAB_0037757c:
      OVar9 = ON_EnvironmentsImpl::SkylightingRenderEnvironmentId(this_00);
      return OVar9;
    }
  }
  OVar9 = ON_EnvironmentsImpl::ReflectionRenderEnvironmentId(this_00);
  return OVar9;
}

Assistant:

ON_UUID ON_3dmRenderSettings::RenderEnvironmentId(EnvironmentUsage usage, EnvironmentPurpose purpose) const
{
  ON_3dmRenderSettingsPrivate::Get(*this);

  // The pointer is never null.
  ON_ASSERT(nullptr != m_private->_environments);

  const auto& e = *m_private->_environments;

  if (EnvironmentPurpose::Standard == purpose)
  {
    switch (usage)
    {
    default:
    case EnvironmentUsage::Background:  return e.BackgroundRenderEnvironmentId();
    case EnvironmentUsage::Reflection:  return e.ReflectionRenderEnvironmentId();
    case EnvironmentUsage::Skylighting: return e.SkylightingRenderEnvironmentId();
    }
  }
  else
  if (EnvironmentPurpose::ForRendering == purpose)
  {
    switch (usage)
    {
    default:
    case EnvironmentUsage::Background:
      {
      if (m_background_style != 3)
        return ON_nil_uuid;

      const auto uuid_env = e.BackgroundRenderEnvironmentId();
      if (ON_UuidIsNotNil(uuid_env))
        return uuid_env;

      return ON_UuidDefaultEnvironmentInstance;
      }

    case EnvironmentUsage::Reflection:
      if (e.ReflectionRenderEnvironmentOverride())
        return e.ReflectionRenderEnvironmentId();

      return RenderEnvironmentId(EnvironmentUsage::Background, purpose);

    case EnvironmentUsage::Skylighting:
      if (!Skylight().Enabled())
        return ON_nil_uuid;

      if (e.SkylightingRenderEnvironmentOverride())
        return e.SkylightingRenderEnvironmentId();

      return RenderEnvironmentId(EnvironmentUsage::Background, purpose);
    }
  }

  ON_ASSERT(false);
  return ON_nil_uuid;
}